

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsqldatabase.cpp
# Opt level: O3

void QSqlDatabase::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  NumericalPrecisionPolicy *pNVar1;
  QSqlDriver *this;
  NumericalPrecisionPolicy NVar2;
  long lVar3;
  
  if (_c == WriteProperty) {
    if (_id == 0) {
      NVar2 = **_a;
      lVar3 = *(long *)_o;
      if (*(QSqlDriver **)(lVar3 + 8) != (QSqlDriver *)0x0) {
        QSqlDriver::setNumericalPrecisionPolicy(*(QSqlDriver **)(lVar3 + 8),NVar2);
        lVar3 = *(long *)_o;
      }
      *(NumericalPrecisionPolicy *)(lVar3 + 0xc0) = NVar2;
    }
  }
  else if ((_c == ReadProperty) && (_id == 0)) {
    pNVar1 = (NumericalPrecisionPolicy *)*_a;
    this = *(QSqlDriver **)(*(long *)_o + 8);
    if (this == (QSqlDriver *)0x0) {
      NVar2 = *(NumericalPrecisionPolicy *)(*(long *)_o + 0xc0);
    }
    else {
      NVar2 = QSqlDriver::numericalPrecisionPolicy(this);
    }
    *pNVar1 = NVar2;
  }
  return;
}

Assistant:

void QSqlDatabase::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QSqlDatabase *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v) = _t->numericalPrecisionPolicy(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNumericalPrecisionPolicy(*reinterpret_cast<QSql::NumericalPrecisionPolicy*>(_v)); break;
        default: break;
        }
    }
}